

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::read_only_file_check(crunch *this,char *pDst_filename)

{
  bool bVar1;
  char *pDst_filename_local;
  crunch *this_local;
  
  bVar1 = crnlib::file_utils::is_read_only(pDst_filename);
  if (bVar1) {
    bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"forcewrite",0,false);
    if (bVar1) {
      bVar1 = crnlib::file_utils::disable_read_only(pDst_filename);
      if (bVar1) {
        crnlib::console::warning("Setting read-only file \"%s\" to writable",pDst_filename);
        this_local._7_1_ = true;
      }
      else {
        crnlib::console::error("Failed setting read-only file \"%s\" to writable!",pDst_filename);
        this_local._7_1_ = false;
      }
    }
    else {
      crnlib::console::error("Output file \"%s\" is read-only!",pDst_filename);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool read_only_file_check(const char* pDst_filename)
    {
        if (!file_utils::is_read_only(pDst_filename))
        {
            return true;
        }

        if (m_params.get_value_as_bool("forcewrite"))
        {
            if (file_utils::disable_read_only(pDst_filename))
            {
                console::warning("Setting read-only file \"%s\" to writable", pDst_filename);
                return true;
            }
            else
            {
                console::error("Failed setting read-only file \"%s\" to writable!", pDst_filename);
                return false;
            }
        }

        console::error("Output file \"%s\" is read-only!", pDst_filename);

        return false;
    }